

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::XmlUnitTestResultPrinter::ListTestsMatchingFilter
          (XmlUnitTestResultPrinter *this,
          vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *test_cases)

{
  FILE *__stream;
  long in_FS_OFFSET;
  stringstream stream;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  __stream = (FILE *)OpenFileForWriting(&this->output_file_);
  std::__cxx11::stringstream::stringstream(local_1a0);
  PrintXmlTestsList(local_190,test_cases);
  StringStreamToString(&local_1c0,(stringstream *)local_1a0);
  fputs(local_1c0._M_dataplus._M_p,__stream);
  std::__cxx11::string::~string((string *)&local_1c0);
  fclose(__stream);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlUnitTestResultPrinter::ListTestsMatchingFilter(
    const std::vector<TestCase*>& test_cases) {
  FILE* xmlout = OpenFileForWriting(output_file_);
  std::stringstream stream;
  PrintXmlTestsList(&stream, test_cases);
  fprintf(xmlout, "%s", StringStreamToString(&stream).c_str());
  fclose(xmlout);
}